

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O1

void DummyProvideTimestep
               (CP_Services Svcs,DP_WS_Stream Stream_v,_SstData *Data,_SstData *LocalMetadata,
               size_t Timestep,void **TimestepInfoPtr)

{
  size_t *psVar1;
  undefined8 *puVar2;
  char *__s;
  
  psVar1 = (size_t *)malloc(0x20);
  puVar2 = (undefined8 *)malloc(0x10);
  __s = (char *)malloc(0x40);
  *puVar2 = __s;
  snprintf(__s,0x40,"Dummy info for timestep %zd from rank %d",Timestep,
           (ulong)*(uint *)((long)Stream_v + 0x10));
  *(int *)(puVar2 + 1) = *(int *)((long)Stream_v + 0x10) * 1000 + (int)Timestep;
  psVar1[1] = (size_t)Data;
  *psVar1 = Timestep;
  psVar1[2] = (size_t)puVar2;
  psVar1[3] = *(size_t *)((long)Stream_v + 0x18);
  *(size_t **)((long)Stream_v + 0x18) = psVar1;
  *TimestepInfoPtr = puVar2;
  return;
}

Assistant:

static void DummyProvideTimestep(CP_Services Svcs, DP_WS_Stream Stream_v, struct _SstData *Data,
                                 struct _SstData *LocalMetadata, size_t Timestep,
                                 void **TimestepInfoPtr)
{
    Dummy_WS_Stream Stream = (Dummy_WS_Stream)Stream_v;
    TimestepList Entry = malloc(sizeof(struct _TimestepEntry));
    struct _DummyPerTimestepInfo *Info = malloc(sizeof(struct _DummyPerTimestepInfo));

    Info->CheckString = malloc(64);
    snprintf(Info->CheckString, 64, "Dummy info for timestep %zd from rank %d", Timestep,
             Stream->Rank);
    Info->CheckInt = Stream->Rank * 1000 + (int)Timestep;
    Entry->Data = Data;
    Entry->Timestep = Timestep;
    Entry->DP_TimestepInfo = Info;

    Entry->Next = Stream->Timesteps;
    Stream->Timesteps = Entry;
    *TimestepInfoPtr = Info;
}